

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entenc.c
# Opt level: O1

uchar * od_ec_enc_done(od_ec_enc *enc,uint32_t *nbytes)

{
  uchar *puVar1;
  short sVar2;
  od_ec_enc_window oVar3;
  bool bVar4;
  uint uVar5;
  int iVar6;
  uchar *__ptr;
  ulong uVar7;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  int iVar11;
  ulong uVar12;
  uint32_t uVar13;
  
  if (enc->error == 0) {
    sVar2 = enc->cnt;
    iVar11 = (int)sVar2;
    oVar3 = enc->low;
    uVar13 = enc->offs;
    iVar6 = iVar11 + 0x11 >> 3;
    iVar8 = 0;
    if (0 < iVar6) {
      iVar8 = iVar6;
    }
    __ptr = enc->buf;
    uVar9 = iVar8 + uVar13;
    if (enc->storage < uVar9) {
      __ptr = (uchar *)realloc(__ptr,(ulong)uVar9);
      if (__ptr == (uchar *)0x0) {
        enc->error = -1;
        goto LAB_0026bf39;
      }
      enc->buf = __ptr;
      enc->storage = uVar9;
    }
    if (-10 < sVar2) {
      uVar12 = oVar3 + 0x3fff & 0xffffffffffff8000 | 0x4000;
      uVar7 = ~(-1L << ((char)sVar2 + 0x10U & 0x3f));
      uVar9 = uVar13 - 1;
      iVar8 = iVar11 + 10;
      do {
        uVar10 = uVar12 >> ((char)iVar11 + 0x10U & 0x3f);
        __ptr[uVar13] = (uchar)uVar10;
        uVar5 = uVar9;
        if (((uint)uVar10 >> 8 & 1) != 0) {
          do {
            puVar1 = __ptr + uVar5;
            *puVar1 = *puVar1 + '\x01';
            uVar5 = uVar5 - 1;
          } while (*puVar1 == '\0');
        }
        uVar13 = uVar13 + 1;
        uVar12 = uVar12 & uVar7;
        iVar11 = iVar11 + -8;
        uVar7 = uVar7 >> 8;
        uVar9 = uVar9 + 1;
        bVar4 = 8 < iVar8;
        iVar8 = iVar8 + -8;
      } while (bVar4);
    }
    *nbytes = uVar13;
  }
  else {
LAB_0026bf39:
    __ptr = (uchar *)0x0;
  }
  return __ptr;
}

Assistant:

unsigned char *od_ec_enc_done(od_ec_enc *enc, uint32_t *nbytes) {
  unsigned char *out;
  uint32_t storage;
  uint32_t offs;
  od_ec_enc_window m;
  od_ec_enc_window e;
  od_ec_enc_window l;
  int c;
  int s;
  if (enc->error) return NULL;
#if OD_MEASURE_EC_OVERHEAD
  {
    uint32_t tell;
    /* Don't count the 1 bit we lose to raw bits as overhead. */
    tell = od_ec_enc_tell(enc) - 1;
    fprintf(stderr, "overhead: %f%%\n",
            100 * (tell - enc->entropy) / enc->entropy);
    fprintf(stderr, "efficiency: %f bits/symbol\n",
            (double)tell / enc->nb_symbols);
  }
#endif

  l = enc->low;
  c = enc->cnt;
  s = 10;
  m = 0x3FFF;
  e = ((l + m) & ~m) | (m + 1);
  s += c;
  offs = enc->offs;

  /*Make sure there's enough room for the entropy-coded bits.*/
  out = enc->buf;
  storage = enc->storage;
  const int s_bits = (s + 7) >> 3;
  int b = OD_MAXI(s_bits, 0);
  if (offs + b > storage) {
    storage = offs + b;
    out = (unsigned char *)realloc(out, sizeof(*out) * storage);
    if (out == NULL) {
      enc->error = -1;
      return NULL;
    }
    enc->buf = out;
    enc->storage = storage;
  }

  /*We output the minimum number of bits that ensures that the symbols encoded
     thus far will be decoded correctly regardless of the bits that follow.*/
  if (s > 0) {
    uint64_t n;
    n = ((uint64_t)1 << (c + 16)) - 1;
    do {
      assert(offs < storage);
      uint16_t val = (uint16_t)(e >> (c + 16));
      out[offs] = (unsigned char)(val & 0x00FF);
      if (val & 0x0100) {
        assert(offs > 0);
        propagate_carry_bwd(out, offs - 1);
      }
      offs++;

      e &= n;
      s -= 8;
      c -= 8;
      n >>= 8;
    } while (s > 0);
  }
  *nbytes = offs;

  return out;
}